

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_piz.c
# Opt level: O0

void applyLut(uint16_t *lut,uint16_t *data,uint64_t nData)

{
  uint64_t i_1;
  int i;
  uint16_t dvals [8];
  uint64_t nData_local;
  uint16_t *data_local;
  uint16_t *lut_local;
  
  data_local = data;
  for (nData_local = nData; 8 < nData_local; nData_local = nData_local - 8) {
    dvals._0_8_ = *(undefined8 *)data_local;
    dvals._8_8_ = *(undefined8 *)(data_local + 4);
    for (i = 0; i < 8; i = i + 1) {
      dvals[i] = lut[dvals[i]];
    }
    *(undefined8 *)data_local = dvals._0_8_;
    *(undefined8 *)(data_local + 4) = dvals._8_8_;
    data_local = data_local + 8;
  }
  for (i_1 = 0; i_1 < nData_local; i_1 = i_1 + 1) {
    data_local[i_1] = lut[data_local[i_1]];
  }
  return;
}

Assistant:

static inline void
applyLut (const uint16_t lut[NO_ALIAS USHORT_RANGE], uint16_t* NO_ALIAS data, uint64_t nData)
{
    /* partially unrolling is noticeably faster */
    uint16_t dvals[8];
    while ( nData > 8 )
    {
        memcpy (dvals, data, sizeof(uint16_t)*8);
        for ( int i = 0; i < 8; ++i )
            dvals[i] = lut[dvals[i]];
        memcpy (data, dvals, sizeof(uint16_t)*8);
        data += 8;
        nData -= 8;
    }

    for (uint64_t i = 0; i < nData; ++i)
        data[i] = lut[data[i]];
}